

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

void write_elements(ang_file *fff,element_info *el_info)

{
  size_t sVar1;
  char *pcVar2;
  int local_42c;
  char local_428 [4];
  int pointer;
  char buf [1024];
  ulong local_20;
  size_t i;
  element_info *el_info_local;
  ang_file *fff_local;
  
  memset(local_428,0,0x400);
  local_42c = 0;
  for (local_20 = 0; local_20 < 0x1c; local_20 = local_20 + 1) {
    if (el_info[local_20].res_level != 100) {
      sVar1 = strlen(local_428);
      if (sVar1 != 0) {
        my_strcat(local_428," | ",0x400);
        local_42c = local_42c + 3;
      }
      pcVar2 = format("RES_%s",write_elements::element_names[local_20]);
      my_strcat(local_428,pcVar2,0x400);
      sVar1 = strlen(write_elements::element_names[local_20]);
      pcVar2 = format("[%d]",(ulong)(100 - (int)el_info[local_20].res_level));
      my_strcat(local_428,pcVar2,0x400);
      local_42c = local_42c + (int)sVar1 + 9;
      if (0x3b < local_42c) {
        file_putf(fff,"%s%s\n","values:",local_428);
        my_strcpy(local_428,"",0x400);
        local_42c = 0;
      }
    }
  }
  if (local_42c != 0) {
    file_putf(fff,"%s%s\n","values:",local_428);
  }
  return;
}

Assistant:

void write_elements(ang_file *fff, const struct element_info *el_info)
{
	size_t i;
	char buf[1024] = "";
	int pointer = 0;

	static const char *element_names[] = {
		#define ELEM(a) #a,
		#include "list-elements.h"
		#undef ELEM
		NULL
	};

	/* Write value list */
	for (i = 0; i < ELEM_MAX; i++) {
		/* If no value, don't write */
		if (el_info[i].res_level == 100) continue;

		/* If this line contains something, write a divider */
		if (strlen(buf)) {
			my_strcat(buf, " | ", sizeof(buf));
			pointer += 3;
		}

		/* Write the name and value */
		my_strcat(buf, format("RES_%s", element_names[i]), sizeof(buf));
		pointer += strlen(element_names[i]) + 4;
		my_strcat(buf, format("[%d]", RES_LEVEL_BASE - el_info[i].res_level),
				  sizeof(buf));
		pointer += 5;

		/* Move to a new line if this one is long enough */
		if (pointer >= 60) {
			file_putf(fff, "%s%s\n", "values:", buf);
			my_strcpy(buf, "", sizeof(buf));
			pointer = 0;
		}
	}

	/* Print remaining values if any */
	if (pointer)
		file_putf(fff, "%s%s\n", "values:", buf);
}